

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandLineArgument.h
# Opt level: O1

void __thiscall
cmCommandLineArgument<bool(std::__cxx11::string_const&,cmake*)>::
cmCommandLineArgument<cmake::SetArgs(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__1&>
          (cmCommandLineArgument<bool(std::__cxx11::string_const&,cmake*)> *this,string *n,
          string *failedMsg,Values t,RequiresSeparator s,anon_class_1_0_00000001 *func)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  size_type local_28;
  pointer local_20;
  
  local_20 = (n->_M_dataplus)._M_p;
  local_28 = n->_M_string_length;
  local_38._M_len = 0x17;
  local_38._M_str = " is invalid syntax for ";
  views._M_len = 2;
  views._M_array = &local_38;
  cmCatViews_abi_cxx11_((string *)this,views);
  *(cmCommandLineArgument<bool(std::__cxx11::string_const&,cmake*)> **)(this + 0x20) = this + 0x30;
  pcVar2 = (failedMsg->_M_dataplus)._M_p;
  paVar1 = &failedMsg->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&failedMsg->field_2 + 8);
    *(size_type *)(this + 0x30) = paVar1->_M_allocated_capacity;
    *(undefined8 *)(this + 0x38) = uVar3;
  }
  else {
    *(pointer *)(this + 0x20) = pcVar2;
    *(size_type *)(this + 0x30) = paVar1->_M_allocated_capacity;
  }
  *(size_type *)(this + 0x28) = failedMsg->_M_string_length;
  (failedMsg->_M_dataplus)._M_p = (pointer)paVar1;
  failedMsg->_M_string_length = 0;
  (failedMsg->field_2)._M_local_buf[0] = '\0';
  *(cmCommandLineArgument<bool(std::__cxx11::string_const&,cmake*)> **)(this + 0x40) = this + 0x50;
  pcVar2 = (n->_M_dataplus)._M_p;
  paVar1 = &n->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&n->field_2 + 8);
    *(size_type *)(this + 0x50) = paVar1->_M_allocated_capacity;
    *(undefined8 *)(this + 0x58) = uVar3;
  }
  else {
    *(pointer *)(this + 0x40) = pcVar2;
    *(size_type *)(this + 0x50) = paVar1->_M_allocated_capacity;
  }
  *(size_type *)(this + 0x48) = n->_M_string_length;
  (n->_M_dataplus)._M_p = (pointer)paVar1;
  n->_M_string_length = 0;
  (n->field_2)._M_local_buf[0] = '\0';
  *(undefined8 *)(this + 0x60) = 0x100000001;
  *(undefined8 *)(this + 0x68) = 0;
  *(undefined8 *)(this + 0x70) = 0;
  *(code **)(this + 0x80) =
       std::
       _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:818:26)>
       ::_M_invoke;
  *(code **)(this + 0x78) =
       std::
       _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:818:26)>
       ::_M_manager;
  return;
}

Assistant:

cmCommandLineArgument(std::string n, std::string failedMsg, Values t,
                        RequiresSeparator s, FunctionType&& func)
    : InvalidSyntaxMessage(cmStrCat(" is invalid syntax for ", n))
    , InvalidValueMessage(std::move(failedMsg))
    , Name(std::move(n))
    , Type(t)
    , SeparatorNeeded(s)
    , StoreCall(std::forward<FunctionType>(func))
  {
  }